

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v6::internal::
     handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<int,fmt::v6::basic_format_specs<char>>>
               (char spec,int_writer<int,_fmt::v6::basic_format_specs<char>_> *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 < 0x62) {
    if (iVar1 < 0x4c) {
      if (iVar1 == 0) {
LAB_001281cc:
        basic_writer<fmt::v6::buffer_range<char>_>::
        int_writer<int,_fmt::v6::basic_format_specs<char>_>::on_dec(handler);
        return;
      }
      if (iVar1 == 0x42) goto LAB_001281dc;
    }
    else {
      if (iVar1 == 0x4c) goto LAB_001281d4;
      if (iVar1 == 0x58) goto LAB_001281ba;
    }
  }
  else if (iVar1 < 0x6e) {
    if (iVar1 == 0x62) {
LAB_001281dc:
      basic_writer<fmt::v6::buffer_range<char>_>::
      int_writer<int,_fmt::v6::basic_format_specs<char>_>::on_bin(handler);
      return;
    }
    if (iVar1 == 100) goto LAB_001281cc;
  }
  else {
    if (iVar1 == 0x6e) {
LAB_001281d4:
      basic_writer<fmt::v6::buffer_range<char>_>::
      int_writer<int,_fmt::v6::basic_format_specs<char>_>::on_num(handler);
      return;
    }
    if (iVar1 == 0x6f) {
      basic_writer<fmt::v6::buffer_range<char>_>::
      int_writer<int,_fmt::v6::basic_format_specs<char>_>::on_oct(handler);
      return;
    }
    if (iVar1 == 0x78) {
LAB_001281ba:
      basic_writer<fmt::v6::buffer_range<char>_>::
      int_writer<int,_fmt::v6::basic_format_specs<char>_>::on_hex(handler);
      return;
    }
  }
  basic_writer<fmt::v6::buffer_range<char>_>::int_writer<int,_fmt::v6::basic_format_specs<char>_>::
  on_error(handler);
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
  case 'L':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}